

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
_applyScaledObj<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *solver,Rational *dualScale,SolRational *sol)

{
  type_conflict5 tVar1;
  uint uVar2;
  long lVar3;
  undefined4 uVar4;
  uint uVar5;
  Rational newRowObj;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_80;
  
  uVar2 = *(uint *)(*(long *)(this + 0x5988) + 0x100);
  do {
    if ((int)uVar2 < 1) {
      uVar2 = *(uint *)(*(long *)(this + 0x5988) + 0x38);
      while (0 < (int)uVar2) {
        newRowObj.m_backend.m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_data.la[0] = 0;
        uVar2 = uVar2 - 1;
        newRowObj.m_backend.m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_limbs = 1;
        newRowObj.m_backend.m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_sign = false;
        newRowObj.m_backend.m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal = true;
        newRowObj.m_backend.m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias = false;
        newRowObj.m_backend.m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_data.la[0] = 1;
        newRowObj.m_backend.m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_sign = false;
        newRowObj.m_backend.m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal = true;
        newRowObj.m_backend.m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias = false;
        newRowObj.m_backend.m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_limbs = newRowObj.m_backend.m_value.num.m_backend.
                   super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   .m_limbs;
        if (*(int *)(*(long *)(this + 0x6118) + (ulong)uVar2 * 4) == 4) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&result.m_backend,0.0,(type *)0x0);
          (*(solver->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x3c])(solver,(ulong)uVar2,&result.m_backend,0);
        }
        else {
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&newRowObj,
                      (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)((sol->_dual).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar2));
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)&newRowObj,
                       (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)dualScale);
          tVar1 = boost::multiprecision::operator>=
                            ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)&newRowObj,
                             (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)(this + 0x40));
          if (tVar1) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                      (&result.m_backend,-*(double *)(*(long *)(this + 0x28) + 0xc0),(type *)0x0);
            (*(solver->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x3c])(solver,(ulong)uVar2,&result.m_backend,0);
          }
          else {
            tVar1 = boost::multiprecision::operator<=
                              ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)&newRowObj,
                               (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)(this + 0x80));
            if (tVar1) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                        (&result.m_backend,*(double *)(*(long *)(this + 0x28) + 0xc0),(type *)0x0);
              (*(solver->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x3c])(solver,(ulong)uVar2,&result.m_backend,0);
            }
            else {
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
              ::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                        (&local_80,
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)&newRowObj,(type *)0x0);
              result.m_backend.data._M_elems[0] = local_80.m_backend.data._M_elems[0];
              result.m_backend.data._M_elems[1] = local_80.m_backend.data._M_elems[1];
              result.m_backend.data._M_elems[2] = local_80.m_backend.data._M_elems[2];
              result.m_backend.data._M_elems[3] = local_80.m_backend.data._M_elems[3];
              result.m_backend.data._M_elems[0xc] = local_80.m_backend.data._M_elems[0xc];
              result.m_backend.data._M_elems[0xd] = local_80.m_backend.data._M_elems[0xd];
              result.m_backend.data._M_elems[0xe] = local_80.m_backend.data._M_elems[0xe];
              result.m_backend.data._M_elems[0xf] = local_80.m_backend.data._M_elems[0xf];
              result.m_backend.data._M_elems[8] = local_80.m_backend.data._M_elems[8];
              result.m_backend.data._M_elems[9] = local_80.m_backend.data._M_elems[9];
              result.m_backend.data._M_elems[10] = local_80.m_backend.data._M_elems[10];
              result.m_backend.data._M_elems[0xb] = local_80.m_backend.data._M_elems[0xb];
              result.m_backend.data._M_elems[4] = local_80.m_backend.data._M_elems[4];
              result.m_backend.data._M_elems[5] = local_80.m_backend.data._M_elems[5];
              result.m_backend.data._M_elems[6] = local_80.m_backend.data._M_elems[6];
              result.m_backend.data._M_elems[7] = local_80.m_backend.data._M_elems[7];
              result.m_backend.exp = local_80.m_backend.exp;
              result.m_backend.neg = local_80.m_backend.neg;
              result.m_backend.fpclass = local_80.m_backend.fpclass;
              result.m_backend.prec_elem = local_80.m_backend.prec_elem;
              if (local_80.m_backend.fpclass != cpp_dec_float_finite ||
                  local_80.m_backend.data._M_elems[0] != 0) {
                result.m_backend.neg = (bool)(local_80.m_backend.neg ^ 1);
              }
              (*(solver->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x3c])(solver,(ulong)uVar2,&result.m_backend,0);
            }
          }
        }
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)&newRowObj);
      }
      return;
    }
    uVar2 = uVar2 - 1;
    lVar3 = (ulong)uVar2 * 0x40;
    tVar1 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)(*(long *)(this + 0x6068) + lVar3),
                       (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)(this + 0x40));
    if (tVar1) {
      uVar4 = (undefined4)*(undefined8 *)(*(long *)(this + 0x28) + 0xc0);
      uVar5 = (uint)((ulong)*(undefined8 *)(*(long *)(this + 0x28) + 0xc0) >> 0x20);
LAB_00396fa5:
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,(double)CONCAT44(uVar5,uVar4),(type *)0x0);
    }
    else {
      tVar1 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)(*(long *)(this + 0x6068) + lVar3),
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)(this + 0x80));
      if (tVar1) {
        uVar4 = (undefined4)*(undefined8 *)(*(long *)(this + 0x28) + 0xc0);
        uVar5 = (uint)((ulong)*(undefined8 *)(*(long *)(this + 0x28) + 0xc0) >> 0x20) ^ 0x80000000;
        goto LAB_00396fa5;
      }
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
      ::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&result.m_backend,
                 (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                  *)(lVar3 + *(long *)(this + 0x6068)),(type *)0x0);
    }
    (*(solver->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x24])(solver,(ulong)uVar2,&result.m_backend,0);
  } while( true );
}

Assistant:

void SoPlexBase<R>::_applyScaledObj(SPxSolverBase<T>& solver, Rational& dualScale, SolRational& sol)
{
   for(int c = numColsRational() - 1; c >= 0; c--)
   {
      if(_modObj[c] >= _rationalPosInfty)
         solver.changeObj(c, realParam(SoPlexBase<R>::INFTY));
      else if(_modObj[c] <= _rationalNegInfty)
         solver.changeObj(c, -realParam(SoPlexBase<R>::INFTY));
      else
         solver.changeObj(c, T(_modObj[c]));
   }

   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      Rational newRowObj;

      if(_rowTypes[r] == RANGETYPE_FIXED)
         solver.changeRowObj(r, T(0.0));
      else
      {
         newRowObj = sol._dual[r];
         newRowObj *= dualScale;

         if(newRowObj >= _rationalPosInfty)
            solver.changeRowObj(r, -realParam(SoPlexBase<R>::INFTY));
         else if(newRowObj <= _rationalNegInfty)
            solver.changeRowObj(r, realParam(SoPlexBase<R>::INFTY));
         else
            solver.changeRowObj(r, -T(newRowObj));
      }
   }
}